

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O2

IOTHUB_CLIENT_RESULT
VerifyMethodCallbackType
          (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData,CALLBACK_TYPE desiredCallbackType,
          _Bool unsubscribing)

{
  CALLBACK_TYPE CVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  undefined7 in_register_00000011;
  char *pcVar4;
  
  CVar1 = (handleData->methodCallback).type;
  if ((int)CONCAT71(in_register_00000011,unsubscribing) == 0) {
    if (CVar1 == desiredCallbackType || CVar1 == CALLBACK_TYPE_NONE) {
      return IOTHUB_CLIENT_OK;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_ERROR;
    }
    pcVar4 = 
    "Need to change callback function with same type of device method function (original or _Ex()";
    iVar3 = 0xa0e;
  }
  else if (CVar1 == CALLBACK_TYPE_NONE) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_ERROR;
    }
    pcVar4 = "not currently set to accept or process incoming messages.";
    iVar3 = 0x9fb;
  }
  else {
    if (CVar1 == desiredCallbackType) {
      return IOTHUB_CLIENT_OK;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_ERROR;
    }
    pcVar4 = "Need to unsubscribe with same type of device method function (original or _Ex()";
    iVar3 = 0xa00;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
            ,"VerifyMethodCallbackType",iVar3,1,pcVar4);
  return IOTHUB_CLIENT_ERROR;
}

Assistant:

static IOTHUB_CLIENT_RESULT VerifyMethodCallbackType(IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData, CALLBACK_TYPE desiredCallbackType, bool unsubscribing)
{
    IOTHUB_CLIENT_RESULT result;

    if (unsubscribing)
    {
        // If we are unsubscribing,  method (Ex or the original non-Ex) performing the unsubscribe must be the same function that subscribed initially.
        if (handleData->methodCallback.type == CALLBACK_TYPE_NONE)
        {
            LogError("not currently set to accept or process incoming messages.");
            result = IOTHUB_CLIENT_ERROR;
        }
        else if (handleData->methodCallback.type != desiredCallbackType)
        {
            LogError("Need to unsubscribe with same type of device method function (original or _Ex()");
            result = IOTHUB_CLIENT_ERROR;
        }
        else
        {
            result = IOTHUB_CLIENT_OK;
        }
    }
    else
    {
        // If we are already subscribed and changing the callback method, the type of method (Ex or original non-Ex) must match what was used for the original subscribe.
        if ((handleData->methodCallback.type != CALLBACK_TYPE_NONE) &&
            (handleData->methodCallback.type != desiredCallbackType))
        {
            LogError("Need to change callback function with same type of device method function (original or _Ex()");
            result = IOTHUB_CLIENT_ERROR;
        }
        else
        {
            result = IOTHUB_CLIENT_OK;
        }
    }

    return result;
}